

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

int stbi_psd_test_file(FILE *f)

{
  uint32 uVar1;
  long lVar2;
  stbi s;
  stbi local_40;
  
  lVar2 = ftell((FILE *)f);
  local_40.img_file = f;
  uVar1 = get32(&local_40);
  fseek((FILE *)f,(long)(int)lVar2,0);
  return (int)(uVar1 == 0x38425053);
}

Assistant:

int stbi_psd_test_file(FILE *f)
{
   stbi s;
   int r,n = ftell(f);
   start_file(&s, f);
   r = psd_test(&s);
   fseek(f,n,SEEK_SET);
   return r;
}